

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECUPort.cc
# Opt level: O2

Values * __thiscall
SSM::ECUPort::singleRead(Values *__return_storage_ptr__,ECUPort *this,Observables *observables)

{
  undefined8 *puVar1;
  int iVar2;
  Observable **obs;
  undefined8 *puVar3;
  pointer pbVar4;
  double local_48;
  Bytes response;
  
  buildReadRequest(&response,this,observables,false);
  sendRequest(this,&response,3);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&response.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  readECUPacket(&response,this,false);
  pbVar4 = response.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start + 5;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = *(undefined8 **)(observables + 8);
  for (puVar3 = *(undefined8 **)observables; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    local_48 = (double)(*(code *)**(undefined8 **)*puVar3)((undefined8 *)*puVar3,pbVar4);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (__return_storage_ptr__,&local_48);
    iVar2 = (**(code **)(*(long *)*puVar3 + 0x18))();
    pbVar4 = pbVar4 + iVar2;
  }
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&response.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  return __return_storage_ptr__;
}

Assistant:

Values ECUPort::singleRead(const Observables& observables) const
  {
    sendRequest(buildReadRequest(observables, false));

    Bytes response = readECUPacket(false);
    Bytes::const_iterator it = skipToData(response);
    Values values;
    for(const auto& obs: observables)
      {
	values.push_back(obs->convert(it));
	it += obs->numBytes();
      }
    
    return values;
  }